

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_header.c
# Opt level: O1

int mk_header_prepare(mk_http_session *cs,mk_http_request *sr,mk_server *server)

{
  unsigned_long *puVar1;
  mk_list *pmVar2;
  mk_list *pmVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  iovec *piVar7;
  unsigned_long uVar8;
  long lVar9;
  mk_iov *pmVar10;
  int iVar11;
  int extraout_EAX;
  unsigned_long uVar12;
  char **data;
  char *pcVar13;
  size_t sVar14;
  mk_ptr_t *p;
  size_t sVar15;
  mk_list *pmVar16;
  long lVar17;
  bool bVar18;
  char *buffer;
  unsigned_long len;
  char *local_48;
  unsigned_long local_40;
  mk_server *local_38;
  
  local_40 = 0;
  local_48 = (char *)0x0;
  uVar4 = (sr->headers).status;
  pcVar13 = (char *)(ulong)uVar4;
  if (uVar4 == 7) {
    pcVar13 = (sr->headers).custom_status.data;
    iVar11 = (int)(sr->headers).custom_status.len;
    bVar18 = false;
  }
  else {
    lVar17 = 8;
    iVar11 = 0x120b20;
    do {
      if (*(uint *)((long)&mk_header_upgrade_h2c.len + lVar17) == uVar4) {
        pcVar13 = *(char **)((long)&status_response[0].status + lVar17);
        iVar11 = *(int *)((long)&mk_header_upgrade_h2c.len + lVar17 + 4);
        bVar18 = lVar17 == 0x268;
        goto LAB_00110800;
      }
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0x268);
    bVar18 = true;
  }
LAB_00110800:
  if (bVar18) {
    mk_header_prepare_cold_1();
    mk_iov_free_marked((mk_iov *)cs->conn);
    return extraout_EAX;
  }
  piVar7 = (sr->headers).headers_iov.io;
  iVar5 = (sr->headers).headers_iov.iov_idx;
  lVar17 = (long)iVar5;
  piVar7[lVar17].iov_base = pcVar13;
  piVar7[lVar17].iov_len = (long)iVar11;
  lVar17 = lVar17 + 1;
  (sr->headers).headers_iov.iov_idx = (int)lVar17;
  uVar12 = (long)iVar11 + (sr->headers).headers_iov.total_len;
  (sr->headers).headers_iov.total_len = uVar12;
  sVar15 = (size_t)(int)(server->clock_context->headers_preset).len;
  piVar7[lVar17].iov_base = (server->clock_context->headers_preset).data;
  piVar7[lVar17].iov_len = sVar15;
  (sr->headers).headers_iov.iov_idx = iVar5 + 2;
  (sr->headers).headers_iov.total_len = uVar12 + sVar15;
  if (0 < (sr->headers).last_modified) {
    data = (char **)pthread_getspecific(mk_tls_cache_header_lm);
    iVar11 = mk_utils_utime2gmt(data,(sr->headers).last_modified);
    pcVar13 = (char *)(long)iVar11;
    data[1] = pcVar13;
    piVar7 = (sr->headers).headers_iov.io;
    iVar11 = (sr->headers).headers_iov.iov_idx;
    lVar17 = (long)iVar11;
    piVar7[lVar17].iov_base = "Last-Modified: ";
    piVar7[lVar17].iov_len = 0xf;
    lVar17 = lVar17 + 1;
    (sr->headers).headers_iov.iov_idx = (int)lVar17;
    uVar12 = (sr->headers).headers_iov.total_len;
    (sr->headers).headers_iov.total_len = uVar12 + 0xf;
    piVar7[lVar17].iov_base = *data;
    piVar7[lVar17].iov_len = (size_t)pcVar13;
    (sr->headers).headers_iov.iov_idx = iVar11 + 2;
    (sr->headers).headers_iov.total_len = (unsigned_long)(pcVar13 + uVar12 + 0xf);
  }
  iVar11 = (sr->headers).connection;
  if (iVar11 == 0xb) {
    sVar15 = 0x15;
    pcVar13 = "Connection: Upgrade\r\n";
  }
  else {
    if (iVar11 != 0) goto LAB_00110971;
    if (cs->close_now == 0) {
      if (((sr->connection).len == 0) || (sr->protocol == 0xb)) goto LAB_00110971;
      sVar15 = 0x18;
      pcVar13 = "Connection: Keep-Alive\r\n";
    }
    else {
      sVar15 = 0x13;
      pcVar13 = "Connection: Close\r\n";
    }
  }
  piVar7 = (sr->headers).headers_iov.io;
  iVar11 = (sr->headers).headers_iov.iov_idx;
  piVar7[iVar11].iov_base = pcVar13;
  piVar7[iVar11].iov_len = sVar15;
  (sr->headers).headers_iov.iov_idx = iVar11 + 1;
  puVar1 = &(sr->headers).headers_iov.total_len;
  *puVar1 = *puVar1 + sVar15;
LAB_00110971:
  pcVar13 = (sr->headers).location;
  if (pcVar13 != (char *)0x0) {
    piVar7 = (sr->headers).headers_iov.io;
    iVar11 = (sr->headers).headers_iov.iov_idx;
    lVar17 = (long)iVar11;
    piVar7[lVar17].iov_base = "Location: ";
    piVar7[lVar17].iov_len = 10;
    lVar17 = lVar17 + 1;
    (sr->headers).headers_iov.iov_idx = (int)lVar17;
    uVar12 = (sr->headers).headers_iov.total_len;
    (sr->headers).headers_iov.total_len = uVar12 + 10;
    local_38 = server;
    sVar14 = strlen(pcVar13);
    piVar7[lVar17].iov_base = pcVar13;
    piVar7[lVar17].iov_len = (long)(int)sVar14;
    (sr->headers).headers_iov.iov_idx = iVar11 + 2;
    (sr->headers).headers_iov.total_len = (long)(int)sVar14 + 10U + uVar12;
    iVar11 = (sr->headers).headers_iov.buf_idx;
    (sr->headers).headers_iov.buf_to_free[iVar11] = pcVar13;
    (sr->headers).headers_iov.buf_idx = iVar11 + 1;
    server = local_38;
  }
  uVar12 = (sr->headers).allow_methods.len;
  if (uVar12 != 0) {
    piVar7 = (sr->headers).headers_iov.io;
    iVar11 = (sr->headers).headers_iov.iov_idx;
    lVar17 = (long)iVar11;
    piVar7[lVar17].iov_base = "Allow: ";
    piVar7[lVar17].iov_len = 7;
    lVar17 = lVar17 + 1;
    (sr->headers).headers_iov.iov_idx = (int)lVar17;
    pcVar13 = (sr->headers).allow_methods.data;
    uVar8 = (sr->headers).headers_iov.total_len;
    (sr->headers).headers_iov.total_len = uVar8 + 7;
    piVar7[lVar17].iov_base = pcVar13;
    sVar15 = (size_t)(int)uVar12;
    piVar7[lVar17].iov_len = sVar15;
    (sr->headers).headers_iov.iov_idx = iVar11 + 2;
    (sr->headers).headers_iov.total_len = sVar15 + uVar8 + 7;
  }
  uVar12 = (sr->headers).content_type.len;
  if (uVar12 != 0) {
    piVar7 = (sr->headers).headers_iov.io;
    iVar11 = (sr->headers).headers_iov.iov_idx;
    piVar7[iVar11].iov_base = (sr->headers).content_type.data;
    sVar15 = (size_t)(int)uVar12;
    piVar7[iVar11].iov_len = sVar15;
    (sr->headers).headers_iov.iov_idx = iVar11 + 1;
    puVar1 = &(sr->headers).headers_iov.total_len;
    *puVar1 = *puVar1 + sVar15;
  }
  iVar11 = (sr->headers).transfer_encoding;
  if (iVar11 == 0) {
    piVar7 = (sr->headers).headers_iov.io;
    iVar5 = (sr->headers).headers_iov.iov_idx;
    piVar7[iVar5].iov_base = "Transfer-Encoding: chunked\r\n";
    piVar7[iVar5].iov_len = 0x1c;
    (sr->headers).headers_iov.iov_idx = iVar5 + 1;
    puVar1 = &(sr->headers).headers_iov.total_len;
    *puVar1 = *puVar1 + 0x1c;
  }
  sVar15 = (size_t)(sr->headers).etag_len;
  if (0 < (long)sVar15) {
    piVar7 = (sr->headers).headers_iov.io;
    iVar5 = (sr->headers).headers_iov.iov_idx;
    piVar7[iVar5].iov_base = (sr->headers).etag_buf;
    piVar7[iVar5].iov_len = sVar15;
    (sr->headers).headers_iov.iov_idx = iVar5 + 1;
    puVar1 = &(sr->headers).headers_iov.total_len;
    *puVar1 = *puVar1 + sVar15;
  }
  uVar12 = (sr->headers).content_encoding.len;
  if (uVar12 != 0) {
    piVar7 = (sr->headers).headers_iov.io;
    iVar5 = (sr->headers).headers_iov.iov_idx;
    lVar17 = (long)iVar5;
    piVar7[lVar17].iov_base = "Content-Encoding: ";
    piVar7[lVar17].iov_len = 0x12;
    lVar17 = lVar17 + 1;
    (sr->headers).headers_iov.iov_idx = (int)lVar17;
    pcVar13 = (sr->headers).content_encoding.data;
    uVar8 = (sr->headers).headers_iov.total_len;
    (sr->headers).headers_iov.total_len = uVar8 + 0x12;
    piVar7[lVar17].iov_base = pcVar13;
    sVar15 = (size_t)(int)uVar12;
    piVar7[lVar17].iov_len = sVar15;
    (sr->headers).headers_iov.iov_idx = iVar5 + 2;
    (sr->headers).headers_iov.total_len = sVar15 + uVar8 + 0x12;
  }
  if ((iVar11 != 0) && (-1 < (sr->headers).content_length)) {
    p = (mk_ptr_t *)pthread_getspecific(mk_tls_cache_header_cl);
    mk_string_itop((sr->headers).content_length,p);
    piVar7 = (sr->headers).headers_iov.io;
    iVar11 = (sr->headers).headers_iov.iov_idx;
    lVar17 = (long)iVar11;
    piVar7[lVar17].iov_base = "Content-Length: ";
    piVar7[lVar17].iov_len = 0x10;
    lVar17 = lVar17 + 1;
    (sr->headers).headers_iov.iov_idx = (int)lVar17;
    uVar12 = (sr->headers).headers_iov.total_len;
    (sr->headers).headers_iov.total_len = uVar12 + 0x10;
    sVar15 = (size_t)(int)p->len;
    piVar7[lVar17].iov_base = p->data;
    piVar7[lVar17].iov_len = sVar15;
    (sr->headers).headers_iov.iov_idx = iVar11 + 2;
    (sr->headers).headers_iov.total_len = sVar15 + uVar12 + 0x10;
  }
  if ((sr->headers).content_length != 0) {
    uVar4 = (sr->headers).ranges[0];
    if (((-1 < (int)uVar4) || (-1 < (sr->headers).ranges[1])) && (server->resume == '\x01')) {
      local_48 = (char *)0x0;
      if ((-1 < (int)uVar4) && ((sr->headers).ranges[1] == -1)) {
        lVar17 = (sr->headers).real_length;
        mk_string_build(&local_48,&local_40,"%s bytes %d-%ld/%ld\r\n","Content-Range:",(ulong)uVar4,
                        lVar17 + -1,lVar17);
        piVar7 = (sr->headers).headers_iov.io;
        iVar11 = (sr->headers).headers_iov.iov_idx;
        piVar7[iVar11].iov_base = local_48;
        piVar7[iVar11].iov_len = (long)(int)local_40;
        (sr->headers).headers_iov.iov_idx = iVar11 + 1;
        puVar1 = &(sr->headers).headers_iov.total_len;
        *puVar1 = *puVar1 + (long)(int)local_40;
        iVar11 = (sr->headers).headers_iov.buf_idx;
        (sr->headers).headers_iov.buf_to_free[iVar11] = local_48;
        (sr->headers).headers_iov.buf_idx = iVar11 + 1;
      }
      uVar4 = (sr->headers).ranges[0];
      if ((-1 < (int)uVar4) && (uVar6 = (sr->headers).ranges[1], -1 < (int)uVar6)) {
        mk_string_build(&local_48,&local_40,"%s bytes %d-%d/%ld\r\n","Content-Range:",(ulong)uVar4,
                        (ulong)uVar6,(sr->headers).real_length);
        piVar7 = (sr->headers).headers_iov.io;
        iVar11 = (sr->headers).headers_iov.iov_idx;
        piVar7[iVar11].iov_base = local_48;
        piVar7[iVar11].iov_len = (long)(int)local_40;
        (sr->headers).headers_iov.iov_idx = iVar11 + 1;
        puVar1 = &(sr->headers).headers_iov.total_len;
        *puVar1 = *puVar1 + (long)(int)local_40;
        iVar11 = (sr->headers).headers_iov.buf_idx;
        (sr->headers).headers_iov.buf_to_free[iVar11] = local_48;
        (sr->headers).headers_iov.buf_idx = iVar11 + 1;
      }
      if (((sr->headers).ranges[0] == -1) && (lVar17 = (long)(sr->headers).ranges[1], 0 < lVar17)) {
        lVar9 = (sr->headers).real_length;
        mk_string_build(&local_48,&local_40,"%s bytes %ld-%ld/%ld\r\n","Content-Range:",
                        lVar9 - lVar17,lVar9 + -1,lVar9);
        piVar7 = (sr->headers).headers_iov.io;
        iVar11 = (sr->headers).headers_iov.iov_idx;
        piVar7[iVar11].iov_base = local_48;
        piVar7[iVar11].iov_len = (long)(int)local_40;
        (sr->headers).headers_iov.iov_idx = iVar11 + 1;
        puVar1 = &(sr->headers).headers_iov.total_len;
        *puVar1 = *puVar1 + (long)(int)local_40;
        iVar11 = (sr->headers).headers_iov.buf_idx;
        (sr->headers).headers_iov.buf_to_free[iVar11] = local_48;
        (sr->headers).headers_iov.buf_idx = iVar11 + 1;
      }
    }
  }
  if ((sr->headers).upgrade == 0x14) {
    piVar7 = (sr->headers).headers_iov.io;
    iVar11 = (sr->headers).headers_iov.iov_idx;
    piVar7[iVar11].iov_base = "Upgrade: h2c\r\n";
    piVar7[iVar11].iov_len = 0xe;
    (sr->headers).headers_iov.iov_idx = iVar11 + 1;
    puVar1 = &(sr->headers).headers_iov.total_len;
    *puVar1 = *puVar1 + 0xe;
  }
  if (((sr->headers).cgi == 0) || ((sr->headers).breakline == 1)) {
    pmVar10 = (sr->headers)._extra_rows;
    if (pmVar10 == (mk_iov *)0x0) {
      pmVar10 = &(sr->headers).headers_iov;
      piVar7 = (sr->headers).headers_iov.io;
      iVar11 = (sr->headers).headers_iov.iov_idx;
      piVar7[iVar11].iov_base = "\r\n";
      piVar7[iVar11].iov_len = 2;
      (sr->headers).headers_iov.iov_idx = iVar11 + 1;
    }
    else {
      piVar7 = pmVar10->io;
      iVar11 = pmVar10->iov_idx;
      piVar7[iVar11].iov_base = "\r\n";
      piVar7[iVar11].iov_len = 2;
      pmVar10->iov_idx = iVar11 + 1;
    }
    pmVar10->total_len = pmVar10->total_len + 2;
  }
  (sr->in_headers).buffer = &(sr->headers).headers_iov;
  pmVar10 = (sr->headers)._extra_rows;
  (sr->in_headers).bytes_total = (sr->headers).headers_iov.total_len;
  (sr->in_headers).cb_finished = mk_header_cb_finished;
  if (pmVar10 != (mk_iov *)0x0) {
    (sr->in_headers_extra).type = 1;
    (sr->in_headers_extra).dynamic = 0;
    (sr->in_headers_extra).cb_consumed = (_func_void_mk_stream_input_ptr_long *)0x0;
    (sr->in_headers_extra).cb_finished = cb_stream_iov_extended_free;
    (sr->in_headers_extra).stream = &sr->stream;
    (sr->in_headers_extra).buffer = pmVar10;
    (sr->in_headers_extra).bytes_total = pmVar10->total_len;
    pmVar2 = &(sr->in_headers_extra)._head;
    pmVar3 = &(sr->in_headers)._head;
    pmVar16 = (sr->stream).inputs.prev;
    if ((pmVar16 == pmVar3) || (pmVar16 == (sr->stream).inputs.next)) {
      (sr->stream).inputs.prev = pmVar2;
      (sr->in_headers_extra)._head.next = &(sr->stream).inputs;
      (sr->in_headers_extra)._head.prev = pmVar16;
      pmVar16 = (mk_list *)&pmVar16->next;
    }
    else {
      pmVar16 = (sr->in_headers)._head.next;
      (sr->in_headers_extra)._head.next = pmVar16;
      (sr->in_headers_extra)._head.prev = pmVar3;
      (sr->in_headers)._head.next = pmVar2;
    }
    pmVar16->prev = pmVar2;
  }
  (sr->headers).sent = 1;
  return 0;
}

Assistant:

int mk_header_prepare(struct mk_http_session *cs, struct mk_http_request *sr,
                      struct mk_server *server)
{
    int i = 0;
    unsigned long len = 0;
    char *buffer = 0;
    mk_ptr_t response;
    struct response_headers *sh;
    struct mk_iov *iov;

    sh = &sr->headers;
    iov = &sh->headers_iov;

    /* HTTP Status Code */
    if (sh->status == MK_CUSTOM_STATUS) {
        response.data = sh->custom_status.data;
        response.len = sh->custom_status.len;
    }
    else {
        for (i = 0; i < status_response_len; i++) {
            if (status_response[i].status == sh->status) {
                response.data = status_response[i].response;
                response.len  = status_response[i].length;
                break;
            }
        }
    }

    /* Invalid status set */
    mk_bug(i == status_response_len);

    mk_iov_add(iov, response.data, response.len, MK_FALSE);

    /*
     * Preset headers (mk_clock.c):
     *
     * - Server
     * - Date
     */
    mk_iov_add(iov,
               server->clock_context->headers_preset.data,
               server->clock_context->headers_preset.len,
               MK_FALSE);

    /* Last-Modified */
    if (sh->last_modified > 0) {
        mk_ptr_t *lm = MK_TLS_GET(mk_tls_cache_header_lm);
        lm->len = mk_utils_utime2gmt(&lm->data, sh->last_modified);

        mk_iov_add(iov,
                   mk_header_last_modified.data,
                   mk_header_last_modified.len,
                   MK_FALSE);
        mk_iov_add(iov,
                   lm->data,
                   lm->len,
                   MK_FALSE);
    }

    /* Connection */
    if (sh->connection == 0) {
        if (cs->close_now == MK_FALSE) {
            if (sr->connection.len > 0) {
                if (sr->protocol != MK_HTTP_PROTOCOL_11) {
                    mk_iov_add(iov,
                               mk_header_conn_ka.data,
                               mk_header_conn_ka.len,
                               MK_FALSE);
                }
            }
        }
        else {
            mk_iov_add(iov,
                       mk_header_conn_close.data,
                       mk_header_conn_close.len,
                       MK_FALSE);
        }
    }
    else if (sh->connection == MK_HEADER_CONN_UPGRADED) {
             mk_iov_add(iov,
                        mk_header_conn_upgrade.data,
                        mk_header_conn_upgrade.len,
                        MK_FALSE);
    }

    /* Location */
    if (sh->location != NULL) {
        mk_iov_add(iov,
                   mk_header_short_location.data,
                   mk_header_short_location.len,
                   MK_FALSE);

        mk_iov_add(iov,
                   sh->location,
                   strlen(sh->location),
                   MK_TRUE);
    }

    /* allowed methods */
    if (sh->allow_methods.len > 0) {
        mk_iov_add(iov,
                   mk_header_allow.data,
                   mk_header_allow.len,
                   MK_FALSE);
        mk_iov_add(iov,
                   sh->allow_methods.data,
                   sh->allow_methods.len,
                   MK_FALSE);
    }

    /* Content type */
    if (sh->content_type.len > 0) {
        mk_iov_add(iov,
                   sh->content_type.data,
                   sh->content_type.len,
                   MK_FALSE);
    }

    /*
     * Transfer Encoding: the transfer encoding header is just sent when
     * the response has some content defined by the HTTP status response
     */
    switch (sh->transfer_encoding) {
    case MK_HEADER_TE_TYPE_CHUNKED:
        mk_iov_add(iov,
                   mk_header_te_chunked.data,
                   mk_header_te_chunked.len,
                   MK_FALSE);
        break;
    }

    /* E-Tag */
    if (sh->etag_len > 0) {
        mk_iov_add(iov, sh->etag_buf, sh->etag_len, MK_FALSE);
    }

    /* Content-Encoding */
    if (sh->content_encoding.len > 0) {
        mk_iov_add(iov, mk_header_content_encoding.data,
                   mk_header_content_encoding.len,
                   MK_FALSE);
        mk_iov_add(iov, sh->content_encoding.data,
                   sh->content_encoding.len,
                   MK_FALSE);
    }

    /* Content-Length */
    if (sh->content_length >= 0 && sh->transfer_encoding != 0) {
        /* Map content length to MK_POINTER */
        mk_ptr_t *cl = MK_TLS_GET(mk_tls_cache_header_cl);
        mk_string_itop(sh->content_length, cl);

        /* Set headers */
        mk_iov_add(iov,
                   mk_header_content_length.data,
                   mk_header_content_length.len,
                   MK_FALSE);
        mk_iov_add(iov,
                   cl->data,
                   cl->len,
                   MK_FALSE);
    }

    if ((sh->content_length != 0 && (sh->ranges[0] >= 0 || sh->ranges[1] >= 0)) &&
        server->resume == MK_TRUE) {
        buffer = 0;

        /* yyy- */
        if (sh->ranges[0] >= 0 && sh->ranges[1] == -1) {
            mk_string_build(&buffer,
                            &len,
                            "%s bytes %d-%ld/%ld\r\n",
                            RH_CONTENT_RANGE,
                            sh->ranges[0],
                            (sh->real_length - 1), sh->real_length);
            mk_iov_add(iov, buffer, len, MK_TRUE);
        }

        /* yyy-xxx */
        if (sh->ranges[0] >= 0 && sh->ranges[1] >= 0) {
            mk_string_build(&buffer,
                            &len,
                            "%s bytes %d-%d/%ld\r\n",
                            RH_CONTENT_RANGE,
                            sh->ranges[0], sh->ranges[1], sh->real_length);

            mk_iov_add(iov, buffer, len, MK_TRUE);
        }

        /* -xxx */
        if (sh->ranges[0] == -1 && sh->ranges[1] > 0) {
            mk_string_build(&buffer,
                            &len,
                            "%s bytes %ld-%ld/%ld\r\n",
                            RH_CONTENT_RANGE,
                            (sh->real_length - sh->ranges[1]),
                            (sh->real_length - 1), sh->real_length);
            mk_iov_add(iov, buffer, len, MK_TRUE);
        }
    }

    if (sh->upgrade == MK_HEADER_UPGRADED_H2C) {
        mk_iov_add(iov, mk_header_upgrade_h2c.data, mk_header_upgrade_h2c.len,
                   MK_FALSE);
    }


    if (sh->cgi == SH_NOCGI || sh->breakline == MK_HEADER_BREAKLINE) {
        if (!sr->headers._extra_rows) {
            mk_iov_add(iov, mk_iov_crlf.data, mk_iov_crlf.len,
                       MK_FALSE);
        }
        else {
            mk_iov_add(sr->headers._extra_rows, mk_iov_crlf.data,
                       mk_iov_crlf.len, MK_FALSE);
        }
    }

    /*
     * Configure the Stream to dispatch the headers
     */

    /* Set the IOV input stream */
    sr->in_headers.buffer      = iov;
    sr->in_headers.bytes_total = iov->total_len;
    sr->in_headers.cb_finished = mk_header_cb_finished;

    if (sr->headers._extra_rows) {
        /* Our main sr->stream contains the main headers (header_iov)
         * and 'may' have already some linked data. If we have some
         * extra headers rows we need to link this IOV right after
         * the main header_iov.
         */
        struct mk_stream_input *in = &sr->in_headers_extra;
        in->type        = MK_STREAM_IOV;
        in->dynamic     = MK_FALSE;
        in->cb_consumed = NULL;
        in->cb_finished = cb_stream_iov_extended_free;
        in->stream      = &sr->stream;
        in->buffer      = sr->headers._extra_rows;
        in->bytes_total = sr->headers._extra_rows->total_len;

        mk_list_add_after(&sr->in_headers_extra._head,
                          &sr->in_headers._head,
                          &sr->stream.inputs);
    }

    sh->sent = MK_TRUE;

    return 0;
}